

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int cmCTest::HTTPRequest
              (string *url,HTTPMethod method,string *response,string *fields,string *putFile,
              int timeout)

{
  pointer pcVar1;
  string *psVar2;
  bool bVar3;
  CURLcode CVar4;
  CURL *curl;
  FILE *pFVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string local_50;
  
  local_58 = response;
  curl_global_init(3);
  curl = curl_easy_init();
  cmCurlSetCAInfo_abi_cxx11_(&local_50,curl,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (method != HTTP_GET) {
    if (method != HTTP_PUT) {
      if (method == HTTP_POST) {
        curl_easy_setopt(curl,CURLOPT_POST,1);
        curl_easy_setopt(curl,CURLOPT_POSTFIELDS,(fields->_M_dataplus)._M_p);
      }
      goto LAB_00251903;
    }
    bVar3 = cmsys::SystemTools::FileExists((putFile->_M_dataplus)._M_p);
    psVar2 = local_58;
    if (!bVar3) {
      std::__cxx11::string::_M_replace
                ((ulong)local_58,0,(char *)local_58->_M_string_length,0x5881a0);
      pcVar1 = (putFile->_M_dataplus)._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + putFile->_M_string_length);
      std::__cxx11::string::append((char *)&local_78);
      std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      return -1;
    }
    curl_easy_setopt(curl,CURLOPT_PUT,1);
    pFVar5 = cmsys::SystemTools::Fopen(putFile,"rb");
    curl_easy_setopt(curl,CURLOPT_READDATA,pFVar5);
  }
  if (fields->_M_string_length != 0) {
    std::operator+(&local_78,"?",fields);
    std::__cxx11::string::_M_append((char *)url,(ulong)local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00251903:
  curl_easy_setopt(curl,CURLOPT_URL,(url->_M_dataplus)._M_p);
  curl_easy_setopt(curl,CURLOPT_TIMEOUT,(ulong)(uint)timeout);
  curl_easy_setopt(curl,CURLOPT_FOLLOWLOCATION,1);
  curl_easy_setopt(curl,CURLOPT_WRITEFUNCTION,HTTPResponseCallback);
  curl_easy_setopt(curl,CURLOPT_WRITEDATA,local_58);
  curl_easy_setopt(curl,CURLOPT_FAILONERROR,1);
  CVar4 = curl_easy_perform(curl);
  curl_easy_cleanup(curl);
  curl_global_cleanup();
  return CVar4;
}

Assistant:

int cmCTest::HTTPRequest(std::string url, HTTPMethod method,
                                       std::string& response,
                                       std::string fields,
                                       std::string putFile, int timeout)
{
  CURL* curl;
  FILE* file;
  ::curl_global_init(CURL_GLOBAL_ALL);
  curl = ::curl_easy_init();
  cmCurlSetCAInfo(curl);

  //set request options based on method
  switch(method)
    {
    case cmCTest::HTTP_POST:
      ::curl_easy_setopt(curl, CURLOPT_POST, 1);
      ::curl_easy_setopt(curl, CURLOPT_POSTFIELDS, fields.c_str());
      break;
    case cmCTest::HTTP_PUT:
      if(!cmSystemTools::FileExists(putFile.c_str()))
        {
        response = "Error: File ";
        response += putFile + " does not exist.\n";
        return -1;
        }
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      file = cmsys::SystemTools::Fopen(putFile, "rb");
      ::curl_easy_setopt(curl, CURLOPT_INFILE, file);
      //fall through to append GET fields
    case cmCTest::HTTP_GET:
      if(!fields.empty())
        {
        url += "?" + fields;
        }
      break;
    }

  ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
  ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1);

  //set response options
  ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, HTTPResponseCallback);
  ::curl_easy_setopt(curl, CURLOPT_FILE, (void *)&response);
  ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);

  CURLcode res = ::curl_easy_perform(curl);

  ::curl_easy_cleanup(curl);
  ::curl_global_cleanup();

  return static_cast<int>(res);
}